

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testScanLineApi.cpp
# Opt level: O3

void testScanLineApi(string *tempDir)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  byte bVar4;
  char cVar5;
  bool bVar6;
  ushort uVar7;
  int iVar8;
  uint *puVar9;
  half *phVar10;
  float *pfVar11;
  long *plVar12;
  long lVar13;
  float fVar14;
  uint uVar15;
  ulong uVar16;
  int lorder;
  float *pfVar17;
  int W;
  uint *puVar18;
  half *phVar19;
  LineOrder lorder_00;
  long lVar20;
  undefined8 uVar21;
  double dVar22;
  Array2D<float> pf;
  Array2D<Imath_3_2::half> ph;
  Array2D<unsigned_int> pi;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing the scanline API for tiled files",0x28);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  pi._sizeX = 0x51;
  pi._sizeY = 0x30;
  puVar9 = (uint *)operator_new__(0x3cc0);
  ph._sizeX = 0x51;
  ph._sizeY = 0x30;
  pi._data = puVar9;
  phVar10 = (half *)operator_new__(0x1e60);
  pf._sizeX = 0x51;
  pf._sizeY = 0x30;
  ph._data = phVar10;
  pfVar11 = (float *)operator_new__(0x3cc0);
  iVar8 = 0;
  lVar13 = 0;
  pfVar17 = pfVar11;
  puVar18 = puVar9;
  phVar19 = phVar10;
  pf._data = pfVar11;
  do {
    lVar20 = -0x30;
    do {
      puVar18[lVar20 + 0x30] = (int)lVar20 + iVar8 + 0x30;
      dVar1 = (double)((int)lVar20 + 0x30);
      dVar22 = sin(dVar1);
      dVar2 = sin((double)(int)lVar13 * 0.5);
      fVar14 = ABS((float)(dVar2 + dVar22));
      uVar7 = (ushort)((uint)(float)(dVar2 + dVar22) >> 0x10) & 0x8000;
      if ((uint)fVar14 < 0x38800000) {
        if ((0x33000000 < (uint)fVar14) &&
           (uVar15 = (uint)fVar14 & 0x7fffff | 0x800000, cVar5 = (char)((uint)fVar14 >> 0x17),
           uVar7 = uVar7 | (ushort)(uVar15 >> (0x7eU - cVar5 & 0x1f)),
           0x80000000 < uVar15 << (cVar5 + 0xa2U & 0x1f))) {
          uVar7 = uVar7 + 1;
        }
      }
      else if ((uint)fVar14 < 0x7f800000) {
        if ((uint)fVar14 < 0x477ff000) {
          uVar7 = (ushort)((int)fVar14 + 0x8000fff + (uint)(((uint)fVar14 >> 0xd & 1) != 0) >> 0xd)
                  | uVar7;
        }
        else {
          uVar7 = uVar7 | 0x7c00;
        }
      }
      else {
        uVar7 = uVar7 | 0x7c00;
        if (fVar14 != INFINITY) {
          uVar15 = (uint)fVar14 >> 0xd & 0x3ff;
          uVar7 = uVar7 | (ushort)uVar15 | (ushort)(uVar15 == 0);
        }
      }
      phVar19[lVar20 + 0x30]._h = uVar7;
      dVar22 = sin((double)(int)lVar13);
      dVar1 = sin(dVar1 * 0.5);
      pfVar17[lVar20 + 0x30] = (float)(dVar1 + dVar22);
      lVar20 = lVar20 + 1;
    } while (lVar20 != 0);
    lVar13 = lVar13 + 1;
    pfVar17 = pfVar17 + 0x30;
    phVar19 = phVar19 + 0x30;
    puVar18 = puVar18 + 0x30;
    iVar8 = iVar8 + 100;
  } while (lVar13 != 0x51);
  bVar4 = IlmThread_3_2::supportsThreads();
  uVar16 = 0;
  do {
    uVar21 = 0x19eaf3;
    cVar5 = IlmThread_3_2::supportsThreads();
    if (cVar5 != '\0') {
      Imf_3_2::setGlobalThreadCount((int)uVar16);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nnumber of threads: ",0x14);
      iVar8 = Imf_3_2::globalThreadCount();
      plVar12 = (long *)std::ostream::operator<<(&std::cout,iVar8);
      std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
      std::ostream::put((char)plVar12);
      uVar21 = 0x19eb53;
      std::ostream::flush();
    }
    iVar8 = 0;
    do {
      lorder_00 = INCREASING_Y;
      bVar3 = true;
      do {
        bVar6 = bVar3;
        W = (int)&pf;
        anon_unknown.dwarf_2d7a6a::writeRead
                  ((string *)(tempDir->_M_dataplus)._M_p,
                   (Array2D<unsigned_int> *)tempDir->_M_string_length,
                   (Array2D<Imath_3_2::half> *)&pi,(Array2D<float> *)&ph,W,iVar8,lorder_00,
                   NO_COMPRESSION,ROUND_DOWN,1,1,(int)uVar21,(int)uVar16);
        anon_unknown.dwarf_2d7a6a::writeRead
                  ((string *)(tempDir->_M_dataplus)._M_p,
                   (Array2D<unsigned_int> *)tempDir->_M_string_length,
                   (Array2D<Imath_3_2::half> *)&pi,(Array2D<float> *)&ph,W,iVar8,lorder_00,
                   0xffffffef,0xffffffe3,1,1,(int)uVar21,(int)uVar16);
        anon_unknown.dwarf_2d7a6a::writeRead
                  ((string *)(tempDir->_M_dataplus)._M_p,
                   (Array2D<unsigned_int> *)tempDir->_M_string_length,
                   (Array2D<Imath_3_2::half> *)&pi,(Array2D<float> *)&ph,W,iVar8,lorder_00,
                   NO_COMPRESSION,ROUND_DOWN,0x18,0x1a,(int)uVar21,(int)uVar16);
        anon_unknown.dwarf_2d7a6a::writeRead
                  ((string *)(tempDir->_M_dataplus)._M_p,
                   (Array2D<unsigned_int> *)tempDir->_M_string_length,
                   (Array2D<Imath_3_2::half> *)&pi,(Array2D<float> *)&ph,W,iVar8,lorder_00,
                   0xffffffef,0xffffffe3,0x18,0x1a,(int)uVar21,(int)uVar16);
        anon_unknown.dwarf_2d7a6a::writeRead
                  ((string *)(tempDir->_M_dataplus)._M_p,
                   (Array2D<unsigned_int> *)tempDir->_M_string_length,
                   (Array2D<Imath_3_2::half> *)&pi,(Array2D<float> *)&ph,W,iVar8,lorder_00,
                   NO_COMPRESSION,ROUND_DOWN,0x30,0x51,(int)uVar21,(int)uVar16);
        anon_unknown.dwarf_2d7a6a::writeRead
                  ((string *)(tempDir->_M_dataplus)._M_p,
                   (Array2D<unsigned_int> *)tempDir->_M_string_length,
                   (Array2D<Imath_3_2::half> *)&pi,(Array2D<float> *)&ph,W,iVar8,lorder_00,
                   0xffffffef,0xffffffe3,0x30,0x51,(int)uVar21,(int)uVar16);
        anon_unknown.dwarf_2d7a6a::writeRead
                  ((string *)(tempDir->_M_dataplus)._M_p,
                   (Array2D<unsigned_int> *)tempDir->_M_string_length,
                   (Array2D<Imath_3_2::half> *)&pi,(Array2D<float> *)&ph,W,iVar8,lorder_00,
                   NO_COMPRESSION,ROUND_DOWN,0x80,0x60,(int)uVar21,(int)uVar16);
        anon_unknown.dwarf_2d7a6a::writeRead
                  ((string *)(tempDir->_M_dataplus)._M_p,
                   (Array2D<unsigned_int> *)tempDir->_M_string_length,
                   (Array2D<Imath_3_2::half> *)&pi,(Array2D<float> *)&ph,W,iVar8,lorder_00,
                   0xffffffef,0xffffffe3,0x80,0x60,(int)uVar21,(int)uVar16);
        lorder_00 = DECREASING_Y;
        bVar3 = false;
      } while (bVar6);
      iVar8 = iVar8 + 1;
    } while (iVar8 != 3);
    uVar15 = (uint)uVar16;
    uVar16 = (ulong)(uVar15 + 1);
  } while ((bVar4 & uVar15 < 3) != 0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  operator_delete__(pfVar11);
  operator_delete__(phVar10);
  operator_delete__(puVar9);
  return;
}

Assistant:

void
testScanLineApi (const std::string& tempDir)
{
    try
    {
        cout << "Testing the scanline API for tiled files" << endl;

        const int W  = 48;
        const int H  = 81;
        const int DX = -17;
        const int DY = -29;

        Array2D<unsigned int> pi (H, W);
        Array2D<half>         ph (H, W);
        Array2D<float>        pf (H, W);
        fillPixels (pi, ph, pf, W, H);

        int maxThreads = ILMTHREAD_NAMESPACE::supportsThreads () ? 3 : 0;

        for (int n = 0; n <= maxThreads; ++n)
        {
            if (ILMTHREAD_NAMESPACE::supportsThreads ())
            {
                setGlobalThreadCount (n);
                cout << "\nnumber of threads: " << globalThreadCount () << endl;
            }

            for (int lorder = 0; lorder < NUM_LINEORDERS; ++lorder)
            {
                for (int rmode = 0; rmode < NUM_ROUNDINGMODES; ++rmode)
                {
                    writeRead (
                        tempDir,
                        pi,
                        ph,
                        pf,
                        W,
                        H,
                        LineOrder (lorder),
                        ZIP_COMPRESSION,
                        LevelRoundingMode (rmode),
                        0,
                        0,
                        1,
                        1);

                    writeRead (
                        tempDir,
                        pi,
                        ph,
                        pf,
                        W,
                        H,
                        LineOrder (lorder),
                        ZIP_COMPRESSION,
                        LevelRoundingMode (rmode),
                        DX,
                        DY,
                        1,
                        1);

                    writeRead (
                        tempDir,
                        pi,
                        ph,
                        pf,
                        W,
                        H,
                        LineOrder (lorder),
                        ZIP_COMPRESSION,
                        LevelRoundingMode (rmode),
                        0,
                        0,
                        24,
                        26);

                    writeRead (
                        tempDir,
                        pi,
                        ph,
                        pf,
                        W,
                        H,
                        LineOrder (lorder),
                        ZIP_COMPRESSION,
                        LevelRoundingMode (rmode),
                        DX,
                        DY,
                        24,
                        26);

                    writeRead (
                        tempDir,
                        pi,
                        ph,
                        pf,
                        W,
                        H,
                        LineOrder (lorder),
                        ZIP_COMPRESSION,
                        LevelRoundingMode (rmode),
                        0,
                        0,
                        48,
                        81);

                    writeRead (
                        tempDir,
                        pi,
                        ph,
                        pf,
                        W,
                        H,
                        LineOrder (lorder),
                        ZIP_COMPRESSION,
                        LevelRoundingMode (rmode),
                        DX,
                        DY,
                        48,
                        81);

                    writeRead (
                        tempDir,
                        pi,
                        ph,
                        pf,
                        W,
                        H,
                        LineOrder (lorder),
                        ZIP_COMPRESSION,
                        LevelRoundingMode (rmode),
                        0,
                        0,
                        128,
                        96);

                    writeRead (
                        tempDir,
                        pi,
                        ph,
                        pf,
                        W,
                        H,
                        LineOrder (lorder),
                        ZIP_COMPRESSION,
                        LevelRoundingMode (rmode),
                        DX,
                        DY,
                        128,
                        96);
                }
            }
        }

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}